

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

AActor * P_LineAttack(AActor *t1,DAngle *angle,double distance,DAngle *pitch,int damage,
                     FName *damageType,PClassActor *pufftype,int flags,FTranslatedLineTarget *victim
                     ,int *actualdamage)

{
  player_t *ppVar1;
  BYTE *pBVar2;
  AWeapon *pAVar3;
  double dVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  byte bVar9;
  DWORD flags_00;
  int iVar10;
  int iVar11;
  PClassActor *pPVar12;
  AActor *pAVar13;
  byte bVar14;
  byte bVar15;
  uint flags_01;
  AActor *pAVar16;
  byte bVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  uint local_24c;
  AActor *local_248;
  undefined4 local_240;
  byte local_23c;
  byte local_23b;
  undefined2 local_23a;
  undefined1 local_238 [16];
  FName *local_220;
  undefined1 local_218 [16];
  DVector3 local_208;
  undefined4 local_1ec;
  undefined1 local_1e8 [16];
  double local_1d0;
  DAngle *local_1c8;
  double local_1c0;
  FName local_1b8;
  FName local_1b4;
  FSoundID local_1b0;
  ActorFlags local_1ac;
  FTraceResults trace;
  DVector2 ofs;
  DVector3 local_c8;
  DAngle local_b0;
  DAngle local_a8;
  DAngle local_a0;
  DAngle local_98;
  DAngle local_90;
  DAngle local_88;
  DAngle local_80;
  sector_t *local_78;
  DAngle local_70;
  DAngle local_68;
  DAngle local_60;
  DAngle local_58;
  DAngle local_50;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  
  if (victim != (FTranslatedLineTarget *)0x0) {
    (victim->attackAngleFromSource).Degrees = 0.0;
    *(undefined8 *)&victim->unlinked = 0;
    victim->linetarget = (AActor *)0x0;
    (victim->angleFromSource).Degrees = 0.0;
  }
  if (actualdamage != (int *)0x0) {
    *actualdamage = 0;
  }
  local_248 = t1;
  local_220 = damageType;
  local_1c0 = distance;
  dVar4 = TAngle<double>::Cos(pitch);
  local_218._8_4_ = extraout_XMM0_Dc;
  local_218._0_8_ = dVar4;
  local_218._12_4_ = extraout_XMM0_Dd;
  dVar4 = TAngle<double>::Cos(angle);
  local_238._8_4_ = extraout_XMM0_Dc_00;
  local_238._0_8_ = dVar4;
  local_238._12_4_ = extraout_XMM0_Dd_00;
  dVar4 = TAngle<double>::Sin(angle);
  local_1e8._8_4_ = extraout_XMM0_Dc_01;
  local_1e8._0_8_ = dVar4;
  local_1e8._12_4_ = extraout_XMM0_Dd_01;
  local_c8.Z = TAngle<double>::Sin(pitch);
  local_c8.Z = -local_c8.Z;
  local_c8.X = (double)local_238._0_8_ * (double)local_218._0_8_;
  local_c8.Y = (double)local_1e8._0_8_ * (double)local_218._0_8_;
  ppVar1 = t1->player;
  local_24c = 2;
  local_1ec = (undefined4)CONCAT71((int7)((ulong)angle >> 8),1);
  if (ppVar1 == (player_t *)0x0) {
    local_1d0 = 8.0;
  }
  else {
    local_1d0 = ppVar1->mo->AttackZOffset * ppVar1->crouchfactor;
    if ((local_220->Index == 0xcd) || (local_220->Index == 0x89)) {
      local_24c = 0x22;
      local_1ec = 0;
    }
  }
  local_218._0_8_ = (t1->Height * 0.5 + (t1->__Pos).Z) - t1->Floorclip;
  pPVar12 = PClassActor::GetReplacement(pufftype,true);
  auVar7 = local_1e8;
  pBVar2 = (pPVar12->super_PClass).Defaults;
  uVar18 = local_218._0_4_;
  uVar19 = local_218._4_4_;
  if (((t1->player == (player_t *)0x0) ||
      (pAVar3 = t1->player->ReadyWeapon, pAVar3 == (AWeapon *)0x0)) ||
     (((pAVar3->super_AStateProvider).super_AInventory.super_AActor.flags2.Value & 0x4000) == 0)) {
    if (pBVar2 != (BYTE *)0x0) {
      local_23c = (byte)(*(uint *)(pBVar2 + 0x1c0) >> 0xe) & 1;
      goto LAB_00418e19;
    }
    local_23c = 0;
    bVar15 = 0;
    bVar9 = 0;
    local_23b = 0;
  }
  else {
    local_23c = 1;
    if (pBVar2 == (BYTE *)0x0) {
      bVar15 = 0;
      bVar9 = 0;
      local_23b = 0;
    }
    else {
LAB_00418e19:
      bVar15 = (pBVar2[0x1c5] & 0x40) >> 6;
      local_23b = pBVar2[0x1d0] >> 2 & 1;
      bVar9 = 1;
    }
  }
  local_240 = 0;
  local_1e8._4_4_ = 0;
  local_1e8._0_4_ = flags * 8 & 0x10;
  local_238._0_8_ = pBVar2;
  local_1e8._8_8_ = auVar7._8_8_;
  local_1c8 = pitch;
  if ((pBVar2[0x1d6] & 0x40) == 0) {
    local_23a = 0;
  }
  else {
    if (bVar9 == 0) {
      bVar17 = 0;
      bVar14 = 0;
    }
    else {
      bVar17 = pBVar2[0x1d0] >> 1 & 1;
      bVar14 = (byte)(*(uint *)(pBVar2 + 0x1c0) >> 0x14) & 1;
    }
    local_23a = CONCAT11(bVar14,bVar17);
    trace.Sector = (sector_t *)(t1->__Pos).X;
    trace._8_8_ = (t1->__Pos).Y;
    trace.HitPos.X = (t1->__Pos).Z;
    pAVar13 = Spawn(pufftype,(DVector3 *)&trace,ALLOW_REPLACE);
    uVar18 = local_218._0_4_;
    uVar19 = local_218._4_4_;
    if (pAVar13 != (AActor *)0x0) {
      AActor::GetSpecies((AActor *)&trace);
      local_240 = trace.Sector._0_4_;
      (*(pAVar13->super_DThinker).super_DObject._vptr_DObject[4])(pAVar13);
      uVar18 = local_218._0_4_;
      uVar19 = local_218._4_4_;
    }
  }
  local_208.Z = (double)CONCAT44(uVar19,uVar18) + local_1d0;
  iVar10 = local_220->Index;
  uVar6 = local_238._0_8_;
  if ((iVar10 == 0) || (iVar10 == 0x89)) {
    if (bVar9 != 0) goto LAB_00418f6f;
    flags_00 = (uint)((flags & 8U) == 0) * 4 + 1;
    bVar17 = 0;
  }
  else {
    if ((bVar9 & iVar10 == 0xcd) != 0) {
LAB_00418f6f:
      if (*(int *)(local_238._0_8_ + 0x404) != 0) {
        local_220->Index = *(int *)(local_238._0_8_ + 0x404);
      }
    }
    bVar17 = (byte)((flags & 8U) >> 3);
    if (bVar9 == 1 && bVar17 == 0) {
      flags_00 = (uint)((*(byte *)(local_238._0_8_ + 0x1d2) & 1) == 0) * 4 + 1;
      bVar17 = 1;
    }
    else {
      bVar17 = bVar17 & bVar9;
      flags_00 = (uint)((flags & 8U) == 0) * 4 + 1;
    }
  }
  flags_01 = local_1e8._0_4_ + (flags & 1U) * 2;
  local_208.X = (t1->__Pos).X;
  local_208.Y = (t1->__Pos).Y;
  local_1ac.Value = 4;
  bVar8 = Trace(&local_208,(sector_t_conflict *)t1->Sector,&local_c8,local_1c0,&local_1ac,0x8008000,
                t1,&trace,flags_00,CheckForActor,&local_248);
  if (bVar8) {
    if (trace.HitType == TRACE_HitActor) {
      local_208.X = trace.HitPos.X;
      local_208.Y = trace.HitPos.Y;
      local_208.Z = trace.HitPos.Z;
      if ((i_compatflags._3_1_ & 0x10) != 0) {
        P_GetOffsetPosition(trace.HitPos.X,trace.HitPos.Y,trace.HitVector.X * -10.0,
                            trace.HitVector.Y * -10.0);
        local_208.X = ofs.X;
        local_208.Y = ofs.Y;
        local_208.Z = trace.HitVector.Z * 10.0 + local_208.Z;
      }
      if ((((flags & 8U) == 0) &&
          (((bVar17 == 0 || ((*(byte *)(uVar6 + 0x1c7) & 0x40) == 0)) &&
           ((((trace.Actor)->flags).Value & 0x80000) == 0)))) &&
         ((((trace.Actor)->flags2).Value & 0x18000000) == 0)) {
        pAVar13 = (AActor *)0x0;
      }
      else {
        flags_01 = (flags_01 | ((trace.Actor)->flags).Value >> 0x10 & 8) ^ 8;
        local_58.Degrees = trace.SrcAngleFromTarget.Degrees;
        local_60.Degrees = trace.SrcAngleFromTarget.Degrees + -90.0;
        pAVar13 = P_SpawnPuff(t1,pufftype,&local_208,&local_58,&local_60,2,flags_01 | 1,trace.Actor)
        ;
        if ((flags & 8U) != 0) {
          return pAVar13;
        }
      }
      if (bVar17 == 0) {
        iVar10 = 0;
        if (damage != 0) goto LAB_0041943d;
        bVar5 = true;
        bVar8 = false;
LAB_0041961c:
        ppVar1 = t1->player;
        if (((t1->flags5).Value & 0x100) == 0) {
          if (ppVar1 != (player_t *)0x0) {
            if (ppVar1->ReadyWeapon == (AWeapon *)0x0) {
              bVar15 = 0;
            }
            else {
              bVar15 = ((ppVar1->ReadyWeapon->super_AStateProvider).super_AInventory.field_0x4fc & 8
                       ) >> 3;
            }
LAB_00419666:
            if (ppVar1->ReadyWeapon == (AWeapon *)0x0) {
              if (bVar15 != 0) goto LAB_00419691;
            }
            else {
              bVar9 = ((ppVar1->ReadyWeapon->super_AStateProvider).super_AInventory.field_0x4fc & 8)
                      >> 3;
              if (bVar15 != 0 || bVar9 != 0) goto LAB_00419693;
            }
          }
          if (((((trace.Actor)->flags).Value & 0x80000) == 0) &&
             ((((trace.Actor)->flags2).Value & 0x18000000) == 0)) {
            local_80.Degrees = trace.SrcAngleFromTarget.Degrees;
            iVar11 = damage;
            if (0 < iVar10) {
              iVar11 = iVar10;
            }
            P_SpawnBlood(&local_208,&local_80,iVar11,trace.Actor);
          }
          if (!bVar5) {
LAB_00419766:
            if (0 < iVar10) {
              damage = iVar10;
            }
            local_98.Degrees = trace.SrcAngleFromTarget.Degrees;
            local_a0.Degrees = local_1c8->Degrees;
            P_TraceBleed(damage,&trace.HitPos,trace.Actor,&local_98,&local_a0);
          }
        }
        else {
          bVar15 = 1;
          if (ppVar1 != (player_t *)0x0) goto LAB_00419666;
LAB_00419691:
          bVar9 = 0;
LAB_00419693:
          if (!bVar5) {
            if (((((trace.Actor)->flags).Value & 0x80000) == 0) &&
               ((((trace.Actor)->flags2).Value & 0x18000000) == 0)) {
              if (bVar9 != 0) {
                local_88.Degrees = trace.SrcAngleFromTarget.Degrees;
                P_BloodSplatter2(&local_208,trace.Actor,&local_88);
              }
              iVar11 = FRandom::operator()(&pr_lineattack);
              if (iVar11 < 0xc0) {
                local_90.Degrees = trace.SrcAngleFromTarget.Degrees;
                P_BloodSplatter(&local_208,trace.Actor,&local_90);
              }
            }
            goto LAB_00419766;
          }
        }
      }
      else {
        if (0 < *(int *)(local_238._0_8_ + 0x360)) {
          pAVar16 = pAVar13;
          if (pAVar13 == (AActor *)0x0) {
            pAVar16 = t1;
          }
          local_1b4.Index = *(int *)(local_238._0_8_ + 0x364);
          P_PoisonMobj(trace.Actor,pAVar16,t1,*(int *)(local_238._0_8_ + 0x360),
                       *(int *)(local_238._0_8_ + 0x368),*(int *)(local_238._0_8_ + 0x36c),
                       &local_1b4);
        }
        if (damage == 0) {
          bVar5 = true;
          if ((*(byte *)(local_238._0_8_ + 0x1d0) & 8) != 0) goto LAB_0041943f;
          bVar5 = true;
          iVar10 = 0;
          if ((*(byte *)(local_238._0_8_ + 0x1d5) & 4) != 0) goto LAB_0041943f;
          bVar8 = false;
        }
        else {
LAB_0041943d:
          bVar5 = false;
LAB_0041943f:
          if (((char)local_1ec == '\0' && t1->player != (player_t *)0x0) &&
             (pAVar3 = t1->player->ReadyWeapon, pAVar3 != (AWeapon *)0x0)) {
            local_24c = local_24c |
                        (pAVar3->super_AStateProvider).super_AInventory.super_AActor.flags5.Value >>
                        0xb & 1;
          }
          bVar8 = pAVar13 == (AActor *)0x0;
          if (bVar8) {
            local_68.Degrees = 0.0;
            local_70.Degrees = 0.0;
            pAVar13 = P_SpawnPuff(t1,pufftype,&local_208,&local_68,&local_70,2,flags_01 | 5,
                                  (AActor *)0x0);
          }
          pAVar16 = pAVar13;
          if (pAVar13 == (AActor *)0x0) {
            pAVar16 = t1;
          }
          local_1b8.Index = local_220->Index;
          local_78 = (sector_t *)trace.SrcAngleFromTarget.Degrees;
          iVar10 = P_DamageMobj(trace.Actor,pAVar16,t1,damage,&local_1b8,local_24c | 0x200,
                                trace.SrcAngleFromTarget);
          if (actualdamage != (int *)0x0) {
            *actualdamage = iVar10;
          }
          if (bVar17 == 0) goto LAB_0041961c;
        }
        if ((*(byte *)(local_238._0_8_ + 0x1c7) & 8) == 0) goto LAB_0041961c;
      }
      if (victim != (FTranslatedLineTarget *)0x0) {
        victim->linetarget = trace.Actor;
        uVar18 = SUB84(trace.SrcAngleFromTarget.Degrees,0);
        uVar19 = (undefined4)((ulong)trace.SrcAngleFromTarget.Degrees >> 0x20);
        (victim->attackAngleFromSource).Degrees = trace.SrcAngleFromTarget.Degrees;
        if (trace.unlinked == false) {
          AActor::AngleTo((AActor *)&ofs,t1,SUB81(trace.Actor,0));
          uVar18 = SUB84(ofs.X,0);
          uVar19 = (undefined4)((ulong)ofs.X >> 0x20);
        }
        (victim->angleFromSource).Degrees = (double)CONCAT44(uVar19,uVar18);
        victim->unlinked = trace.unlinked;
      }
    }
    else if ((trace.HitType == TRACE_HitWall && (flags & 8U) == 0) &&
            ((~bVar15 & (trace.Line)->special == 9) != 0)) {
      pAVar13 = (AActor *)0x0;
LAB_00419552:
      if (((trace.Line)->special == 9) ||
         (bVar8 = line_t::isVisualPortal((line_t_conflict *)trace.Line),
         (char)((flags & 4U) >> 2) != '\0' || bVar8)) goto LAB_004195ae;
      if ((*(uint *)(local_238._0_8_ + 0x1d4) >> 0x12 & 1) != 0) goto LAB_004195ae;
      pAVar16 = t1;
      if ((t1->DecalGenerator == (FDecalBase *)0x0) &&
         (((t1->player == (player_t *)0x0 ||
           (pAVar3 = t1->player->ReadyWeapon, pAVar3 == (AWeapon *)0x0)) ||
          ((pAVar3->super_AStateProvider).super_AInventory.super_AActor.DecalGenerator ==
           (FDecalBase *)0x0)))) {
        if (pAVar13 != (AActor *)0x0) {
LAB_004198d6:
          if (pAVar13->DecalGenerator != (FDecalBase *)0x0) {
            pAVar16 = pAVar13;
          }
        }
      }
      else if ((pAVar13 != (AActor *)0x0) && ((*(uint *)(local_238._0_8_ + 0x1d4) & 0x80000) != 0))
      goto LAB_004198d6;
      SpawnShootDecal(pAVar16,&trace);
      bVar8 = false;
    }
    else {
      P_GetOffsetPosition(trace.HitPos.X,trace.HitPos.Y,trace.HitVector.X * -4.0,
                          trace.HitVector.Y * -4.0);
      local_208.Z = trace.HitVector.Z * -4.0 + trace.HitPos.Z;
      local_208.X = ofs.X;
      local_208.Y = ofs.Y;
      local_48.Degrees = trace.SrcAngleFromTarget.Degrees;
      local_50.Degrees = trace.SrcAngleFromTarget.Degrees + -90.0;
      pAVar13 = P_SpawnPuff(t1,pufftype,&local_208,&local_48,&local_50,0,flags_01,(AActor *)0x0);
      pAVar13->radius = 1.52587890625e-05;
      if ((flags & 8U) != 0) {
        return pAVar13;
      }
      if (trace.HitType == TRACE_HitWall) goto LAB_00419552;
LAB_004195ae:
      bVar8 = false;
      if ((((pAVar13 != (AActor *)0x0) && (bVar8 = false, trace.CrossedWater == (sector_t *)0x0)) &&
          (bVar8 = false, (trace.Sector)->heightsec == (sector_t *)0x0)) &&
         (trace.HitType == TRACE_HitFloor)) {
        bVar8 = false;
        P_HitWater(pAVar13,trace.Sector,&trace.HitPos,false,true,false);
      }
    }
    if (trace.CrossedWater != (sector_t *)0x0 || trace.Crossed3DWater != (F3DFloor *)0x0) {
      if (pAVar13 == (AActor *)0x0) {
        local_a8.Degrees = 0.0;
        local_b0.Degrees = 0.0;
        pAVar13 = P_SpawnPuff(t1,pufftype,&trace.HitPos,&local_a8,&local_b0,2,flags_01 | 5,
                              (AActor *)0x0);
        bVar8 = true;
      }
      SpawnDeepSplash(t1,&trace,pAVar13);
    }
    if (pAVar13 == (AActor *)0x0) {
      return (AActor *)0x0;
    }
    if (!bVar8) {
      return pAVar13;
    }
    (*(pAVar13->super_DThinker).super_DObject._vptr_DObject[4])(pAVar13);
LAB_0041988f:
    pAVar13 = (AActor *)0x0;
  }
  else {
    if (((flags & 8U) == 0 & bVar17) == 1) {
      if (*(int *)(uVar6 + 0x3d4) != 0) {
        local_1b0.ID = *(int *)(uVar6 + 0x3d4);
        S_Sound(t1,1,&local_1b0,1.0,1.0);
      }
LAB_004193a2:
      if ((bVar17 == 0) || ((*(byte *)(uVar6 + 0x1c4) & 0x10) == 0)) goto LAB_0041988f;
    }
    else if ((flags & 8U) == 0) goto LAB_004193a2;
    local_38.Degrees = trace.SrcAngleFromTarget.Degrees;
    local_40.Degrees = trace.SrcAngleFromTarget.Degrees;
    pAVar13 = P_SpawnPuff(t1,pufftype,&trace.HitPos,&local_38,&local_40,2,flags_01,(AActor *)0x0);
  }
  return pAVar13;
}

Assistant:

AActor *P_LineAttack(AActor *t1, DAngle angle, double distance,
	DAngle pitch, int damage, FName damageType, PClassActor *pufftype, int flags, FTranslatedLineTarget*victim, int *actualdamage)
{
	bool nointeract = !!(flags & LAF_NOINTERACT);
	DVector3 direction;
	double shootz;
	FTraceResults trace;
	Origin TData;
	TData.Caller = t1;
	bool killPuff = false;
	AActor *puff = NULL;
	int pflag = 0;
	int puffFlags = (flags & LAF_ISMELEEATTACK) ? PF_MELEERANGE : 0;
	bool spawnSky = false;
	if (flags & LAF_NORANDOMPUFFZ)
		puffFlags |= PF_NORANDOMZ;

	if (victim != NULL)
	{
		memset(victim, 0, sizeof(*victim));
	}
	if (actualdamage != NULL)
	{
		*actualdamage = 0;
	}

	double pc = pitch.Cos();

	direction = { pc * angle.Cos(), pc * angle.Sin(), -pitch.Sin() };
	shootz = t1->Center() - t1->Floorclip;

	if (t1->player != NULL)
	{
		shootz += t1->player->mo->AttackZOffset * t1->player->crouchfactor;
		if (damageType == NAME_Melee || damageType == NAME_Hitscan)
		{
			// this is coming from a weapon attack function which needs to transfer information to the obituary code,
			// We need to preserve this info from the damage type because the actual damage type can get overridden by the puff
			pflag = DMG_PLAYERATTACK;
		}
	}
	else
	{
		shootz += 8;
	}

	// We need to check the defaults of the replacement here
	AActor *puffDefaults = GetDefaultByType(pufftype->GetReplacement());
	
	TData.hitGhosts = (t1->player != NULL &&
		t1->player->ReadyWeapon != NULL &&
		(t1->player->ReadyWeapon->flags2 & MF2_THRUGHOST)) ||
		(puffDefaults && (puffDefaults->flags2 & MF2_THRUGHOST));
	
	spawnSky = (puffDefaults && (puffDefaults->flags3 & MF3_SKYEXPLODE));
	TData.MThruSpecies = (puffDefaults && (puffDefaults->flags6 & MF6_MTHRUSPECIES));
	TData.PuffSpecies = NAME_None;

	// [MC] To prevent possible mod breakage, this flag is pretty much necessary.
	// Somewhere, someone is relying on these to spawn on actors and move through them.

	if ((puffDefaults->flags7 & MF7_ALLOWTHRUFLAGS))
	{
		TData.ThruSpecies = (puffDefaults && (puffDefaults->flags6 & MF6_THRUSPECIES));
		TData.ThruActors = (puffDefaults && (puffDefaults->flags2 & MF2_THRUACTORS));

		// [MC] Because this is a one-hit trace event, we need to spawn the puff, get the species
		// and destroy it. Assume there is no species unless tempuff isn't NULL. We cannot get
		// a proper species the same way as puffDefaults flags it appears...

		AActor *tempuff = NULL;
		if (pufftype != NULL)
			tempuff = Spawn(pufftype, t1->Pos(), ALLOW_REPLACE);
		if (tempuff != NULL)
		{
			TData.PuffSpecies = tempuff->GetSpecies();
			tempuff->Destroy();
		}
	}
	else
	{
		TData.ThruSpecies = false;
		TData.ThruActors = false;
	}
	// if the puff uses a non-standard damage type, this will override default, hitscan and melee damage type.
	// All other explicitly passed damage types (currenty only MDK) will be preserved.
	if ((damageType == NAME_None || damageType == NAME_Melee || damageType == NAME_Hitscan) &&
		puffDefaults != NULL && puffDefaults->DamageType != NAME_None)
	{
		damageType = puffDefaults->DamageType;
	}

	int tflags;
	if (nointeract || (puffDefaults && puffDefaults->flags6 & MF6_NOTRIGGER)) tflags = TRACE_NoSky;
	else tflags = TRACE_NoSky | TRACE_Impact;

	if (!Trace(t1->PosAtZ(shootz), t1->Sector, direction, distance, MF_SHOOTABLE, 
		ML_BLOCKEVERYTHING | ML_BLOCKHITSCAN, t1, trace, tflags, CheckForActor, &TData))
	{ // hit nothing
		if (!nointeract && puffDefaults && puffDefaults->ActiveSound)
		{ // Play miss sound
			S_Sound(t1, CHAN_WEAPON, puffDefaults->ActiveSound, 1, ATTN_NORM);
		}

		// [MC] LAF_NOINTERACT guarantees puff spawning and returns it directly to the calling function.
		// No damage caused, no sounds played, no blood splatters.

		if (nointeract || (puffDefaults && puffDefaults->flags3 & MF3_ALWAYSPUFF))
		{ // Spawn the puff anyway
			puff = P_SpawnPuff(t1, pufftype, trace.HitPos, trace.SrcAngleFromTarget, trace.SrcAngleFromTarget, 2, puffFlags);

			if (nointeract)
			{
				return puff;
			}
		}
		else
		{
			return nullptr;
		}
	}
	else
	{
		if (trace.HitType != TRACE_HitActor)
		{
			// position a bit closer for puffs
			if (nointeract || trace.HitType != TRACE_HitWall || ((trace.Line->special != Line_Horizon) || spawnSky))
			{
				DVector2 pos = P_GetOffsetPosition(trace.HitPos.X, trace.HitPos.Y, -trace.HitVector.X * 4, -trace.HitVector.Y * 4);
				puff = P_SpawnPuff(t1, pufftype, DVector3(pos, trace.HitPos.Z - trace.HitVector.Z * 4), trace.SrcAngleFromTarget,
					trace.SrcAngleFromTarget - 90, 0, puffFlags);
				puff->radius = 1/65536.;

				if (nointeract)
				{
					return puff;
				}
			}

			// [RH] Spawn a decal
			if (trace.HitType == TRACE_HitWall && trace.Line->special != Line_Horizon && !trace.Line->isVisualPortal() && !(flags & LAF_NOIMPACTDECAL) && !(puffDefaults->flags7 & MF7_NODECAL))
			{
				// [TN] If the actor or weapon has a decal defined, use that one.
				if (t1->DecalGenerator != NULL ||
					(t1->player != NULL && t1->player->ReadyWeapon != NULL && t1->player->ReadyWeapon->DecalGenerator != NULL))
				{
					// [ZK] If puff has FORCEDECAL set, do not use the weapon's decal
					if (puffDefaults->flags7 & MF7_FORCEDECAL && puff != NULL && puff->DecalGenerator)
						SpawnShootDecal(puff, trace);
					else
						SpawnShootDecal(t1, trace);
				}

				// Else, look if the bulletpuff has a decal defined.
				else if (puff != NULL && puff->DecalGenerator)
				{
					SpawnShootDecal(puff, trace);
				}

				else
				{
					SpawnShootDecal(t1, trace);
				}
			}
			else if (puff != NULL &&
				trace.CrossedWater == NULL &&
				trace.Sector->heightsec == NULL &&
				trace.HitType == TRACE_HitFloor)
			{
				P_HitWater(puff, trace.Sector, trace.HitPos);
			}
		}
		else
		{
			// Hit a thing, so it could be either a puff or blood
			DVector3 bleedpos = trace.HitPos;
			// position a bit closer for puffs/blood if using compatibility mode.
			if (i_compatflags & COMPATF_HITSCAN)
			{
				DVector2 ofs = P_GetOffsetPosition(bleedpos.X, bleedpos.Y, -10 * trace.HitVector.X, -10 * trace.HitVector.Y);
				bleedpos.X = ofs.X;
				bleedpos.Y = ofs.Y;
				bleedpos.Z -= -10 * trace.HitVector.Z;
			}

			// Spawn bullet puffs or blood spots, depending on target type.
			if (nointeract || (puffDefaults && puffDefaults->flags3 & MF3_PUFFONACTORS) ||
				(trace.Actor->flags & MF_NOBLOOD) ||
				(trace.Actor->flags2 & (MF2_INVULNERABLE | MF2_DORMANT)))
			{
				if (!(trace.Actor->flags & MF_NOBLOOD))
					puffFlags |= PF_HITTHINGBLEED;

				// We must pass the unreplaced puff type here 
				puff = P_SpawnPuff(t1, pufftype, bleedpos, trace.SrcAngleFromTarget, trace.SrcAngleFromTarget - 90, 2, puffFlags | PF_HITTHING, trace.Actor);

				if (nointeract)
				{
					return puff;
				}
			}

			// Allow puffs to inflict poison damage, so that hitscans can poison, too.
			if (puffDefaults != NULL && puffDefaults->PoisonDamage > 0 && puffDefaults->PoisonDuration != INT_MIN)
			{
				P_PoisonMobj(trace.Actor, puff ? puff : t1, t1, puffDefaults->PoisonDamage, puffDefaults->PoisonDuration, puffDefaults->PoisonPeriod, puffDefaults->PoisonDamageType);
			}

			// [GZ] If MF6_FORCEPAIN is set, we need to call P_DamageMobj even if damage is 0!
			// Note: The puff may not yet be spawned here so we must check the class defaults, not the actor.
			int newdam = damage;
			if (damage || (puffDefaults != NULL && ((puffDefaults->flags6 & MF6_FORCEPAIN) || (puffDefaults->flags7 & MF7_CAUSEPAIN))))
			{
				int dmgflags = DMG_INFLICTOR_IS_PUFF | pflag;
				// Allow MF5_PIERCEARMOR on a weapon as well.
				if (t1->player != NULL && (dmgflags & DMG_PLAYERATTACK) && t1->player->ReadyWeapon != NULL &&
					t1->player->ReadyWeapon->flags5 & MF5_PIERCEARMOR)
				{
					dmgflags |= DMG_NO_ARMOR;
				}
				
				if (puff == NULL)
				{
					// Since the puff is the damage inflictor we need it here 
					// regardless of whether it is displayed or not.
					puff = P_SpawnPuff(t1, pufftype, bleedpos, 0., 0., 2, puffFlags | PF_HITTHING | PF_TEMPORARY);
					killPuff = true;
				}
				newdam = P_DamageMobj(trace.Actor, puff ? puff : t1, t1, damage, damageType, dmgflags|DMG_USEANGLE, trace.SrcAngleFromTarget);
				if (actualdamage != NULL)
				{
					*actualdamage = newdam;
				}
			}
			if (!(puffDefaults != NULL && puffDefaults->flags3&MF3_BLOODLESSIMPACT))
			{
				bool bloodsplatter = (t1->flags5 & MF5_BLOODSPLATTER) ||
					(t1->player != nullptr &&	t1->player->ReadyWeapon != nullptr &&
						(t1->player->ReadyWeapon->WeaponFlags & WIF_AXEBLOOD));

				bool axeBlood = (t1->player != nullptr &&
					t1->player->ReadyWeapon != nullptr &&
					(t1->player->ReadyWeapon->WeaponFlags & WIF_AXEBLOOD));

				if (!bloodsplatter && !axeBlood &&
					!(trace.Actor->flags & MF_NOBLOOD) &&
					!(trace.Actor->flags2 & (MF2_INVULNERABLE | MF2_DORMANT)))
				{
					P_SpawnBlood(bleedpos, trace.SrcAngleFromTarget, newdam > 0 ? newdam : damage, trace.Actor);
				}

				if (damage)
				{
					if (bloodsplatter || axeBlood)
					{
						if (!(trace.Actor->flags&MF_NOBLOOD) &&
							!(trace.Actor->flags2&(MF2_INVULNERABLE | MF2_DORMANT)))
						{
							if (axeBlood)
							{
								P_BloodSplatter2(bleedpos, trace.Actor, trace.SrcAngleFromTarget);
							}
							if (pr_lineattack() < 192)
							{
								P_BloodSplatter(bleedpos, trace.Actor, trace.SrcAngleFromTarget);
							}
						}
					}
					// [RH] Stick blood to walls
					P_TraceBleed(newdam > 0 ? newdam : damage, trace.HitPos, trace.Actor, trace.SrcAngleFromTarget, pitch);
				}
			}
			if (victim != NULL)
			{
				victim->linetarget = trace.Actor;
				victim->attackAngleFromSource = trace.SrcAngleFromTarget;
				// With arbitrary portals this cannot be calculated so using the actual attack angle is the only option.
				victim->angleFromSource = trace.unlinked? victim->attackAngleFromSource : t1->AngleTo(trace.Actor);
				victim->unlinked = trace.unlinked;
			}
		}
		if (trace.Crossed3DWater || trace.CrossedWater)
		{
			if (puff == NULL)
			{ // Spawn puff just to get a mass for the splash
				puff = P_SpawnPuff(t1, pufftype, trace.HitPos, 0., 0., 2, puffFlags | PF_HITTHING | PF_TEMPORARY);
				killPuff = true;
			}
			SpawnDeepSplash(t1, trace, puff);
		}
	}
	if (killPuff && puff != NULL)
	{
		puff->Destroy();
		puff = NULL;
	}
	return puff;
}